

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLT.h
# Opt level: O2

Index Eigen::internal::llt_inplace<double,1>::unblocked<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (Matrix<double,__1,__1,_0,__1,__1> *mat)

{
  long startRow;
  Index *this;
  long blockRows;
  Index startCol;
  RealScalar RVar1;
  double __x;
  Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>
  local_1a8;
  undefined1 local_138 [8];
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> A20;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false> A21;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> A10;
  Index *local_58;
  long local_50;
  long local_48;
  Index local_40;
  double local_38;
  
  blockRows = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
  if (blockRows !=
      (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols) {
    __assert_fail("mat.rows()==mat.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Cholesky/LLT.h"
                  ,0x136,
                  "static Index Eigen::internal::llt_inplace<double, 1>::unblocked(MatrixType &) [Scalar = double, UpLo = 1, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  local_48 = 0;
  if (0 < blockRows) {
    local_48 = blockRows;
  }
  this = &A21.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
          m_outerStride;
  startCol = 0;
LAB_0014b94a:
  local_40 = blockRows + -1;
  if (local_48 == startCol) {
    startCol = -1;
  }
  else {
    startRow = startCol + 1;
    Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false> *)
               &A20.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                .m_outerStride,mat,startRow,startCol,local_40,1);
    blockRows = local_40;
    Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)this,mat,startCol,0,
               1,startCol);
    local_50 = startRow;
    Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_138,mat,
               startRow,0,blockRows,startCol);
    __x = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
          [(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
           * startCol + startCol];
    local_38 = __x;
    if (startCol != 0) {
      RVar1 = MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
              squaredNorm((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                           *)this);
      __x = local_38 - RVar1;
    }
    if (0.0 < __x) {
      if (__x < 0.0) {
        local_38 = sqrt(__x);
      }
      else {
        local_38 = SQRT(__x);
      }
      (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      [(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows *
       startCol + startCol] = local_38;
      if (blockRows < 1 || startCol == 0) goto LAB_0014baa6;
      A10.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      m_outerStride =
           A21.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
           m_outerStride;
      Product<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>
      ::Product(&local_1a8,(Lhs *)local_138,
                (Rhs *)&A10.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                        .m_outerStride);
      blockRows = local_40;
      local_58 = &A20.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .m_outerStride;
      NoAlias<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,false>,Eigen::MatrixBase>::
      operator-=((NoAlias<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,false>,Eigen::MatrixBase>
                  *)&local_58,
                 (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>
                  *)&local_1a8);
      goto LAB_0014baab;
    }
  }
  return startCol;
LAB_0014baa6:
  startCol = local_50;
  if (0 < blockRows) {
LAB_0014baab:
    DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>::operator/=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_> *)
               &A20.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                .m_outerStride,&local_38);
    startCol = local_50;
  }
  goto LAB_0014b94a;
}

Assistant:

static Index unblocked(MatrixType& mat)
  {
    using std::sqrt;

    eigen_assert(mat.rows()==mat.cols());
    const Index size = mat.rows();
    for(Index k = 0; k < size; ++k)
    {
      Index rs = size-k-1; // remaining size

      Block<MatrixType,Dynamic,1> A21(mat,k+1,k,rs,1);
      Block<MatrixType,1,Dynamic> A10(mat,k,0,1,k);
      Block<MatrixType,Dynamic,Dynamic> A20(mat,k+1,0,rs,k);

      RealScalar x = numext::real(mat.coeff(k,k));
      if (k>0) x -= A10.squaredNorm();
      if (x<=RealScalar(0))
        return k;
      mat.coeffRef(k,k) = x = sqrt(x);
      if (k>0 && rs>0) A21.noalias() -= A20 * A10.adjoint();
      if (rs>0) A21 /= x;
    }
    return -1;
  }